

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

Parser * __thiscall
flatbuffers::FlatCompiler::GetConformParser
          (Parser *__return_storage_ptr__,FlatCompiler *this,FlatCOptions *options)

{
  bool bVar1;
  ulong uVar2;
  flatbuffers *this_00;
  char *__rhs;
  string *buf;
  string local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_368 [8];
  string contents;
  IDLOptions local_338;
  undefined1 local_21;
  FlatCOptions *local_20;
  FlatCOptions *options_local;
  FlatCompiler *this_local;
  Parser *conform_parser;
  
  local_21 = 0;
  local_20 = options;
  options_local = (FlatCOptions *)this;
  this_local = (FlatCompiler *)__return_storage_ptr__;
  IDLOptions::IDLOptions(&local_338);
  Parser::Parser(__return_storage_ptr__,&local_338);
  IDLOptions::~IDLOptions(&local_338);
  buf = (string *)(local_20->opts).lang_to_generate;
  (__return_storage_ptr__->opts).lang_to_generate = (unsigned_long)buf;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_368);
    this_00 = (flatbuffers *)std::__cxx11::string::c_str();
    bVar1 = LoadFile(this_00,(char *)0x1,SUB81((string *)local_368,0),buf);
    if (!bVar1) {
      std::operator+(&local_388,"unable to load schema: ",&local_20->conform_to_schema);
      Error(this,&local_388,true,true);
      std::__cxx11::string::~string((string *)&local_388);
    }
    GetExtension(&local_3a8,&local_20->conform_to_schema);
    __rhs = reflection::SchemaExtension();
    bVar1 = std::operator==(&local_3a8,__rhs);
    std::__cxx11::string::~string((string *)&local_3a8);
    if (bVar1) {
      LoadBinarySchema(this,__return_storage_ptr__,&local_20->conform_to_schema,(string *)local_368)
      ;
    }
    else {
      ParseFile(this,__return_storage_ptr__,&local_20->conform_to_schema,(string *)local_368,
                &local_20->conform_include_directories);
    }
    std::__cxx11::string::~string((string *)local_368);
  }
  return __return_storage_ptr__;
}

Assistant:

flatbuffers::Parser FlatCompiler::GetConformParser(
    const FlatCOptions &options) {
  flatbuffers::Parser conform_parser;

  // conform parser should check advanced options,
  // so, it have to have knowledge about languages:
  conform_parser.opts.lang_to_generate = options.opts.lang_to_generate;

  if (!options.conform_to_schema.empty()) {
    std::string contents;
    if (!flatbuffers::LoadFile(options.conform_to_schema.c_str(), true,
                               &contents)) {
      Error("unable to load schema: " + options.conform_to_schema);
    }

    if (flatbuffers::GetExtension(options.conform_to_schema) ==
        reflection::SchemaExtension()) {
      LoadBinarySchema(conform_parser, options.conform_to_schema, contents);
    } else {
      ParseFile(conform_parser, options.conform_to_schema, contents,
                options.conform_include_directories);
    }
  }
  return conform_parser;
}